

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.c
# Opt level: O3

void xmlURIErrMemory(char *extra)

{
  char *msg;
  
  if (extra == (char *)0x0) {
    msg = "Memory allocation failed\n";
    extra = (char *)0x0;
  }
  else {
    msg = "Memory allocation failed : %s\n";
  }
  __xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,(void *)0x0,
                  (void *)0x0,0x1e,2,XML_ERR_FATAL,(char *)0x0,0,extra,(char *)0x0,(char *)0x0,0,0,
                  msg);
  return;
}

Assistant:

static void
xmlURIErrMemory(const char *extra)
{
    if (extra)
        __xmlRaiseError(NULL, NULL, NULL,
                        NULL, NULL, XML_FROM_URI,
                        XML_ERR_NO_MEMORY, XML_ERR_FATAL, NULL, 0,
                        extra, NULL, NULL, 0, 0,
                        "Memory allocation failed : %s\n", extra);
    else
        __xmlRaiseError(NULL, NULL, NULL,
                        NULL, NULL, XML_FROM_URI,
                        XML_ERR_NO_MEMORY, XML_ERR_FATAL, NULL, 0,
                        NULL, NULL, NULL, 0, 0,
                        "Memory allocation failed\n");
}